

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O3

bool __thiscall doublechecked::Roaring64Map::operator==(Roaring64Map *this,Roaring64Map *r)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = roaring::Roaring64Map::operator==(&this->plain,&r->plain);
  if ((this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (r->check)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>>
                      ((this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<unsigned_long>)
                       &(this->check)._M_t._M_impl.super__Rb_tree_header,
                       (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  _assert_true((ulong)(byte)(bVar1 ^ bVar2 ^ 1),"ans == (check == r.check)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
               ,0x17f);
  return bVar1;
}

Assistant:

bool operator==(const Roaring64Map &r) const {
        bool ans = (plain == r.plain);
        assert_true(ans == (check == r.check));
        return ans;
    }